

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__print_handles(uv_loop_t *loop,int only_active,FILE *stream)

{
  uv_handle_t *h;
  QUEUE *q;
  char *type;
  FILE *stream_local;
  uv_loop_t *puStack_10;
  int only_active_local;
  uv_loop_t *loop_local;
  
  puStack_10 = loop;
  if (loop == (uv_loop_t *)0x0) {
    puStack_10 = uv_default_loop();
  }
  for (h = (uv_handle_t *)puStack_10->handle_queue[0]; h != (uv_handle_t *)puStack_10->handle_queue;
      h = (uv_handle_t *)h->data) {
    if ((only_active == 0) ||
       (((undefined1  [32])h->u & (undefined1  [32])0x4000) != (undefined1  [32])0x0)) {
      switch(*(undefined4 *)&h[-1].next_closing) {
      case 1:
        q = (QUEUE *)anon_var_dwarf_a126ea;
        break;
      case 2:
        q = (QUEUE *)0xa5b2db;
        break;
      case 3:
        q = (QUEUE *)anon_var_dwarf_a12702;
        break;
      case 4:
        q = (QUEUE *)anon_var_dwarf_a1270e;
        break;
      case 5:
        q = (QUEUE *)0xa5eafa;
        break;
      case 6:
        q = (QUEUE *)anon_var_dwarf_814e2e;
        break;
      case 7:
        q = (QUEUE *)0xa5db81;
        break;
      case 8:
        q = (QUEUE *)0xa5ddc0;
        break;
      case 9:
        q = (QUEUE *)anon_var_dwarf_a12756;
        break;
      case 10:
        q = (QUEUE *)0xa5dc35;
        break;
      case 0xb:
        q = (QUEUE *)0xa44d42;
        break;
      case 0xc:
        q = (QUEUE *)anon_var_dwarf_a1277a;
        break;
      case 0xd:
        q = (QUEUE *)anon_var_dwarf_a12786;
        break;
      case 0xe:
        q = (QUEUE *)0xa329dd;
        break;
      case 0xf:
        q = (QUEUE *)anon_var_dwarf_a1279e;
        break;
      case 0x10:
        q = (QUEUE *)anon_var_dwarf_856f;
        break;
      default:
        q = (QUEUE *)anon_var_dwarf_a127b6;
      }
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",
              (ulong)(uint)(int)"R-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x2000
                                                  ) != (undefined1  [32])0x0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"A-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x4000
                                                  ) != (undefined1  [32])0x0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"I-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x8000
                                                  ) != (undefined1  [32])0x0 ^ 0xffU) & 1)],q,
              (undefined1 *)((long)&h[-1].u + 0x10));
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, FILE* stream) {
  const char* type;
  QUEUE* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV__HANDLE_REF)],
            "A-"[!(h->flags & UV__HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV__HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}